

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwr.c
# Opt level: O0

void set_ow_zone(dw_rom *rom,uint8_t x,uint8_t y,uint8_t value)

{
  uint uVar1;
  int zone_index;
  uint8_t value_local;
  uint8_t y_local;
  uint8_t x_local;
  dw_rom *rom_local;
  
  if ((x < 8) && (y < 8)) {
    uVar1 = (uint)x + (uint)y * 8;
    if ((uVar1 & 1) == 0) {
      rom->zone_layout[(int)(uVar1 / 2)] = rom->zone_layout[(int)(uVar1 / 2)] & 0xf;
      rom->zone_layout[(int)(uVar1 / 2)] = rom->zone_layout[(int)(uVar1 / 2)] | value << 4;
    }
    else {
      rom->zone_layout[(int)(uVar1 / 2)] = rom->zone_layout[(int)(uVar1 / 2)] & 0xf0;
      rom->zone_layout[(int)(uVar1 / 2)] = rom->zone_layout[(int)(uVar1 / 2)] | value & 0xf;
    }
  }
  return;
}

Assistant:

static inline void set_ow_zone(dw_rom *rom, uint8_t x, uint8_t y, uint8_t value)
{
    int zone_index;

    if (x > 7 || y > 7)  /* ignore anything out of bounds. */
        return;

    zone_index = x + 8 * y;
    if (zone_index & 1) {
        rom->zone_layout[zone_index / 2] &= 0xf0;  /* second nybble */
        rom->zone_layout[zone_index / 2] |= (0xf & value);
    } else {
        rom->zone_layout[zone_index / 2] &= 0xf; /* first nybble */
        rom->zone_layout[zone_index / 2] |= (0xf0 & (value << 4));
    }
}